

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O2

vtt_block_t * vtt_cue_from_caption_frame(caption_frame_t *frame,vtt_t *vtt)

{
  vtt_block_t *pvVar1;
  size_t sVar2;
  
  pvVar1 = vtt->cue_tail;
  if ((pvVar1 != (vtt_block_t *)0x0) && (pvVar1->duration <= 0.0)) {
    pvVar1->duration = frame->timestamp - pvVar1->timestamp;
  }
  pvVar1 = vtt_block_new(vtt,(utf8_char_t *)0x0,0x7fb,VTT_CUE);
  caption_frame_to_text(frame,(utf8_char_t *)(pvVar1 + 1));
  pvVar1->timestamp = frame->timestamp;
  sVar2 = strlen((char *)(pvVar1 + 1));
  *(undefined2 *)((long)&pvVar1[1].next + sVar2) = 0xa0d;
  *(undefined1 *)((long)&pvVar1[1].next + sVar2 + 2) = 0;
  return pvVar1;
}

Assistant:

vtt_block_t* vtt_cue_from_caption_frame(caption_frame_t* frame, vtt_t* vtt)
{
    if (vtt->cue_tail && 0 >= vtt->cue_tail->duration) {
        vtt->cue_tail->duration = frame->timestamp - vtt->cue_tail->timestamp;
    }

    // CRLF per row, plus an extra at the end
    vtt_block_t* cue = vtt_block_new(vtt, NULL, 2 + CAPTION_FRAME_TEXT_BYTES, VTT_CUE);
    utf8_char_t* data = vtt_block_data(cue);

    caption_frame_to_text(frame, data);
    cue->timestamp = frame->timestamp;
    // vtt requires an extra new line
    strcat((char*)data, "\r\n");
    return cue;
}